

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memdbUnfetch(sqlite3_file *pFile,sqlite3_int64 iOfst,void *pPage)

{
  sqlite3_io_methods *p_00;
  MemStore *p;
  void *pPage_local;
  sqlite3_int64 iOfst_local;
  sqlite3_file *pFile_local;
  
  p_00 = pFile[1].pMethods;
  memdbEnter((MemStore *)p_00);
  *(int *)&p_00->xSync = *(int *)&p_00->xSync + -1;
  memdbLeave((MemStore *)p_00);
  return 0;
}

Assistant:

static int memdbUnfetch(sqlite3_file *pFile, sqlite3_int64 iOfst, void *pPage){
  MemStore *p = ((MemFile*)pFile)->pStore;
  UNUSED_PARAMETER(iOfst);
  UNUSED_PARAMETER(pPage);
  memdbEnter(p);
  p->nMmap--;
  memdbLeave(p);
  return SQLITE_OK;
}